

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upgrade_proto.cpp
# Opt level: O3

bool caffe::UpgradeV0LayerParameter
               (V1LayerParameter *v0_layer_connection,V1LayerParameter *layer_param)

{
  uint32 *puVar1;
  byte *pbVar2;
  float fVar3;
  uint32 uVar4;
  string *psVar5;
  string *psVar6;
  string *psVar7;
  bool bVar8;
  bool bVar9;
  V1LayerParameter_LayerType value;
  uint uVar10;
  Type *pTVar11;
  Type *this;
  Type *from;
  float *pfVar12;
  InnerProductParameter *pIVar13;
  FillerParameter *pFVar14;
  ConvolutionParameter *pCVar15;
  PoolingParameter *pPVar16;
  DropoutParameter *this_00;
  LRNParameter *pLVar17;
  InfogainLossParameter *this_01;
  TransformationParameter *pTVar18;
  HDF5DataParameter *this_02;
  DataParameter *pDVar19;
  ImageDataParameter *pIVar20;
  ConcatParameter *this_03;
  WindowDataParameter *pWVar21;
  HDF5OutputParameter *this_04;
  int iVar22;
  int iVar23;
  FillerParameter *pFVar24;
  HDF5OutputParameter *from_00;
  V0LayerParameter *pVVar25;
  
  V1LayerParameter::Clear(layer_param);
  if (0 < (v0_layer_connection->bottom_).super_RepeatedPtrFieldBase.current_size_) {
    iVar22 = 0;
    do {
      pTVar11 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                          (&(v0_layer_connection->bottom_).super_RepeatedPtrFieldBase,iVar22);
      V1LayerParameter::add_bottom(layer_param,pTVar11);
      iVar22 = iVar22 + 1;
    } while (iVar22 < (v0_layer_connection->bottom_).super_RepeatedPtrFieldBase.current_size_);
  }
  if (0 < (v0_layer_connection->top_).super_RepeatedPtrFieldBase.current_size_) {
    iVar22 = 0;
    do {
      pTVar11 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                          (&(v0_layer_connection->top_).super_RepeatedPtrFieldBase,iVar22);
      V1LayerParameter::add_top(layer_param,pTVar11);
      iVar22 = iVar22 + 1;
    } while (iVar22 < (v0_layer_connection->top_).super_RepeatedPtrFieldBase.current_size_);
  }
  if (((v0_layer_connection->_has_bits_).has_bits_[0] & 2) == 0) {
    return true;
  }
  pVVar25 = v0_layer_connection->layer_;
  if (pVVar25 == (V0LayerParameter *)0x0) {
    pVVar25 = (V0LayerParameter *)&_V0LayerParameter_default_instance_;
  }
  if (((pVVar25->_has_bits_).has_bits_[0] & 1) != 0) {
    psVar5 = (pVVar25->name_).ptr_;
    (layer_param->_has_bits_).has_bits_[0] = (layer_param->_has_bits_).has_bits_[0] | 1;
    psVar6 = (layer_param->name_).ptr_;
    if (psVar6 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
      google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena(&layer_param->name_,psVar5);
    }
    else {
      std::__cxx11::string::_M_assign((string *)psVar6);
    }
  }
  psVar5 = (pVVar25->type_).ptr_;
  if (((pVVar25->_has_bits_).has_bits_[0] & 2) != 0) {
    value = UpgradeV0LayerType(psVar5);
    bVar8 = V1LayerParameter_LayerType_IsValid(value);
    if (!bVar8) {
      __assert_fail("::caffe::V1LayerParameter_LayerType_IsValid(value)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/include/caffe/proto/caffe.pb.h"
                    ,0x5996,
                    "void caffe::V1LayerParameter::set_type(::caffe::V1LayerParameter_LayerType)");
    }
    puVar1 = (layer_param->_has_bits_).has_bits_ + 1;
    *(byte *)puVar1 = (byte)*puVar1 | 1;
    layer_param->type_ = value;
  }
  if (0 < (pVVar25->blobs_).super_RepeatedPtrFieldBase.current_size_) {
    iVar22 = 0;
    do {
      this = google::protobuf::internal::RepeatedPtrFieldBase::
             Add<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>
                       (&(layer_param->blobs_).super_RepeatedPtrFieldBase,(Type *)0x0);
      from = google::protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>
                       (&(pVVar25->blobs_).super_RepeatedPtrFieldBase,iVar22);
      BlobProto::CopyFrom(this,from);
      iVar22 = iVar22 + 1;
    } while (iVar22 < (pVVar25->blobs_).super_RepeatedPtrFieldBase.current_size_);
  }
  if (0 < (pVVar25->blobs_lr_).current_size_) {
    iVar22 = 0;
    do {
      pfVar12 = google::protobuf::RepeatedField<float>::Get(&pVVar25->blobs_lr_,iVar22);
      fVar3 = *pfVar12;
      iVar23 = (layer_param->blobs_lr_).current_size_;
      if (iVar23 == (layer_param->blobs_lr_).total_size_) {
        google::protobuf::RepeatedField<float>::Reserve(&layer_param->blobs_lr_,iVar23 + 1);
        iVar23 = (layer_param->blobs_lr_).current_size_;
      }
      (layer_param->blobs_lr_).current_size_ = iVar23 + 1;
      ((layer_param->blobs_lr_).rep_)->elements[iVar23] = fVar3;
      iVar22 = iVar22 + 1;
    } while (iVar22 < (pVVar25->blobs_lr_).current_size_);
  }
  if (0 < (pVVar25->weight_decay_).current_size_) {
    iVar22 = 0;
    do {
      pfVar12 = google::protobuf::RepeatedField<float>::Get(&pVVar25->weight_decay_,iVar22);
      fVar3 = *pfVar12;
      iVar23 = (layer_param->weight_decay_).current_size_;
      if (iVar23 == (layer_param->weight_decay_).total_size_) {
        google::protobuf::RepeatedField<float>::Reserve(&layer_param->weight_decay_,iVar23 + 1);
        iVar23 = (layer_param->weight_decay_).current_size_;
      }
      (layer_param->weight_decay_).current_size_ = iVar23 + 1;
      ((layer_param->weight_decay_).rep_)->elements[iVar23] = fVar3;
      iVar22 = iVar22 + 1;
    } while (iVar22 < (pVVar25->weight_decay_).current_size_);
  }
  bVar8 = true;
  if (((pVVar25->_has_bits_).has_bits_[0] & 0x100) != 0) {
    iVar22 = std::__cxx11::string::compare((char *)psVar5);
    if (iVar22 == 0) {
      *(byte *)(layer_param->_has_bits_).has_bits_ =
           (byte)(layer_param->_has_bits_).has_bits_[0] | 8;
      pCVar15 = layer_param->convolution_param_;
      if (pCVar15 == (ConvolutionParameter *)0x0) {
        pCVar15 = (ConvolutionParameter *)operator_new(0x98);
        ConvolutionParameter::ConvolutionParameter(pCVar15);
        layer_param->convolution_param_ = pCVar15;
      }
      uVar4 = pVVar25->num_output_;
      (pCVar15->_has_bits_).has_bits_[0] = (pCVar15->_has_bits_).has_bits_[0] | 4;
      pCVar15->num_output_ = uVar4;
    }
    else {
      iVar22 = std::__cxx11::string::compare((char *)psVar5);
      if (iVar22 == 0) {
        pbVar2 = (byte *)((long)(layer_param->_has_bits_).has_bits_ + 1);
        *pbVar2 = *pbVar2 | 4;
        pIVar13 = layer_param->inner_product_param_;
        if (pIVar13 == (InnerProductParameter *)0x0) {
          pIVar13 = (InnerProductParameter *)operator_new(0x38);
          InnerProductParameter::InnerProductParameter(pIVar13);
          layer_param->inner_product_param_ = pIVar13;
        }
        uVar4 = pVVar25->num_output_;
        (pIVar13->_has_bits_).has_bits_[0] = (pIVar13->_has_bits_).has_bits_[0] | 4;
        pIVar13->num_output_ = uVar4;
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Unknown parameter num_output for layer type ",0x2c);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,(psVar5->_M_dataplus)._M_p,psVar5->_M_string_length);
        bVar8 = false;
      }
    }
  }
  if (((pVVar25->_has_bits_).has_bits_[0] & 0x800000) != 0) {
    iVar22 = std::__cxx11::string::compare((char *)psVar5);
    if (iVar22 == 0) {
      *(byte *)(layer_param->_has_bits_).has_bits_ =
           (byte)(layer_param->_has_bits_).has_bits_[0] | 8;
      pCVar15 = layer_param->convolution_param_;
      if (pCVar15 == (ConvolutionParameter *)0x0) {
        pCVar15 = (ConvolutionParameter *)operator_new(0x98);
        ConvolutionParameter::ConvolutionParameter(pCVar15);
        layer_param->convolution_param_ = pCVar15;
      }
      bVar9 = pVVar25->biasterm_;
      (pCVar15->_has_bits_).has_bits_[0] = (pCVar15->_has_bits_).has_bits_[0] | 0x1000;
      pCVar15->bias_term_ = bVar9;
    }
    else {
      iVar22 = std::__cxx11::string::compare((char *)psVar5);
      if (iVar22 == 0) {
        pbVar2 = (byte *)((long)(layer_param->_has_bits_).has_bits_ + 1);
        *pbVar2 = *pbVar2 | 4;
        pIVar13 = layer_param->inner_product_param_;
        if (pIVar13 == (InnerProductParameter *)0x0) {
          pIVar13 = (InnerProductParameter *)operator_new(0x38);
          InnerProductParameter::InnerProductParameter(pIVar13);
          layer_param->inner_product_param_ = pIVar13;
        }
        bVar9 = pVVar25->biasterm_;
        (pIVar13->_has_bits_).has_bits_[0] = (pIVar13->_has_bits_).has_bits_[0] | 0x10;
        pIVar13->bias_term_ = bVar9;
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Unknown parameter biasterm for layer type ",0x2a);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,(psVar5->_M_dataplus)._M_p,psVar5->_M_string_length);
        bVar8 = false;
      }
    }
  }
  if (((pVVar25->_has_bits_).has_bits_[0] & 0x20) != 0) {
    iVar22 = std::__cxx11::string::compare((char *)psVar5);
    if (iVar22 == 0) {
      *(byte *)(layer_param->_has_bits_).has_bits_ =
           (byte)(layer_param->_has_bits_).has_bits_[0] | 8;
      pCVar15 = layer_param->convolution_param_;
      if (pCVar15 == (ConvolutionParameter *)0x0) {
        pCVar15 = (ConvolutionParameter *)operator_new(0x98);
        ConvolutionParameter::ConvolutionParameter(pCVar15);
        layer_param->convolution_param_ = pCVar15;
      }
      *(byte *)(pCVar15->_has_bits_).has_bits_ = (byte)(pCVar15->_has_bits_).has_bits_[0] | 1;
      pFVar14 = pCVar15->weight_filler_;
      if (pFVar14 == (FillerParameter *)0x0) {
        pFVar14 = (FillerParameter *)operator_new(0x40);
        FillerParameter::FillerParameter(pFVar14);
        pCVar15->weight_filler_ = pFVar14;
      }
    }
    else {
      iVar22 = std::__cxx11::string::compare((char *)psVar5);
      if (iVar22 != 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Unknown parameter weight_filler for layer type ",0x2f);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,(psVar5->_M_dataplus)._M_p,psVar5->_M_string_length);
        bVar8 = false;
        goto LAB_0042bb94;
      }
      pbVar2 = (byte *)((long)(layer_param->_has_bits_).has_bits_ + 1);
      *pbVar2 = *pbVar2 | 4;
      pIVar13 = layer_param->inner_product_param_;
      if (pIVar13 == (InnerProductParameter *)0x0) {
        pIVar13 = (InnerProductParameter *)operator_new(0x38);
        InnerProductParameter::InnerProductParameter(pIVar13);
        layer_param->inner_product_param_ = pIVar13;
      }
      *(byte *)(pIVar13->_has_bits_).has_bits_ = (byte)(pIVar13->_has_bits_).has_bits_[0] | 1;
      pFVar14 = pIVar13->weight_filler_;
      if (pFVar14 == (FillerParameter *)0x0) {
        pFVar14 = (FillerParameter *)operator_new(0x40);
        FillerParameter::FillerParameter(pFVar14);
        pIVar13->weight_filler_ = pFVar14;
      }
    }
    pFVar24 = pVVar25->weight_filler_;
    if (pFVar24 == (FillerParameter *)0x0) {
      pFVar24 = (FillerParameter *)&_FillerParameter_default_instance_;
    }
    FillerParameter::CopyFrom(pFVar14,pFVar24);
  }
LAB_0042bb94:
  if (((pVVar25->_has_bits_).has_bits_[0] & 0x40) != 0) {
    iVar22 = std::__cxx11::string::compare((char *)psVar5);
    if (iVar22 == 0) {
      *(byte *)(layer_param->_has_bits_).has_bits_ =
           (byte)(layer_param->_has_bits_).has_bits_[0] | 8;
      pCVar15 = layer_param->convolution_param_;
      if (pCVar15 == (ConvolutionParameter *)0x0) {
        pCVar15 = (ConvolutionParameter *)operator_new(0x98);
        ConvolutionParameter::ConvolutionParameter(pCVar15);
        layer_param->convolution_param_ = pCVar15;
      }
      *(byte *)(pCVar15->_has_bits_).has_bits_ = (byte)(pCVar15->_has_bits_).has_bits_[0] | 2;
      pFVar14 = pCVar15->bias_filler_;
      if (pFVar14 == (FillerParameter *)0x0) {
        pFVar14 = (FillerParameter *)operator_new(0x40);
        FillerParameter::FillerParameter(pFVar14);
        pCVar15->bias_filler_ = pFVar14;
      }
    }
    else {
      iVar22 = std::__cxx11::string::compare((char *)psVar5);
      if (iVar22 != 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Unknown parameter bias_filler for layer type ",0x2d);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,(psVar5->_M_dataplus)._M_p,psVar5->_M_string_length);
        bVar8 = false;
        goto LAB_0042bcbe;
      }
      pbVar2 = (byte *)((long)(layer_param->_has_bits_).has_bits_ + 1);
      *pbVar2 = *pbVar2 | 4;
      pIVar13 = layer_param->inner_product_param_;
      if (pIVar13 == (InnerProductParameter *)0x0) {
        pIVar13 = (InnerProductParameter *)operator_new(0x38);
        InnerProductParameter::InnerProductParameter(pIVar13);
        layer_param->inner_product_param_ = pIVar13;
      }
      *(byte *)(pIVar13->_has_bits_).has_bits_ = (byte)(pIVar13->_has_bits_).has_bits_[0] | 2;
      pFVar14 = pIVar13->bias_filler_;
      if (pFVar14 == (FillerParameter *)0x0) {
        pFVar14 = (FillerParameter *)operator_new(0x40);
        FillerParameter::FillerParameter(pFVar14);
        pIVar13->bias_filler_ = pFVar14;
      }
    }
    pFVar24 = pVVar25->bias_filler_;
    if (pFVar24 == (FillerParameter *)0x0) {
      pFVar24 = (FillerParameter *)&_FillerParameter_default_instance_;
    }
    FillerParameter::CopyFrom(pFVar14,pFVar24);
  }
LAB_0042bcbe:
  if (((pVVar25->_has_bits_).has_bits_[0] & 0x200) != 0) {
    iVar22 = std::__cxx11::string::compare((char *)psVar5);
    if (iVar22 == 0) {
      *(byte *)(layer_param->_has_bits_).has_bits_ =
           (byte)(layer_param->_has_bits_).has_bits_[0] | 8;
      pCVar15 = layer_param->convolution_param_;
      if (pCVar15 == (ConvolutionParameter *)0x0) {
        pCVar15 = (ConvolutionParameter *)operator_new(0x98);
        ConvolutionParameter::ConvolutionParameter(pCVar15);
        layer_param->convolution_param_ = pCVar15;
      }
      uVar10 = pVVar25->pad_;
      iVar22 = (pCVar15->pad_).current_size_;
      if (iVar22 == (pCVar15->pad_).total_size_) {
        google::protobuf::RepeatedField<unsigned_int>::Reserve(&pCVar15->pad_,iVar22 + 1);
        iVar22 = (pCVar15->pad_).current_size_;
      }
      (pCVar15->pad_).current_size_ = iVar22 + 1;
      ((pCVar15->pad_).rep_)->elements[iVar22] = uVar10;
    }
    else {
      iVar22 = std::__cxx11::string::compare((char *)psVar5);
      if (iVar22 == 0) {
        pbVar2 = (byte *)((long)(layer_param->_has_bits_).has_bits_ + 1);
        *pbVar2 = *pbVar2 | 0x10;
        pPVar16 = layer_param->pooling_param_;
        if (pPVar16 == (PoolingParameter *)0x0) {
          pPVar16 = (PoolingParameter *)operator_new(0x48);
          PoolingParameter::PoolingParameter(pPVar16);
          layer_param->pooling_param_ = pPVar16;
        }
        uVar4 = pVVar25->pad_;
        (pPVar16->_has_bits_).has_bits_[0] = (pPVar16->_has_bits_).has_bits_[0] | 4;
        pPVar16->pad_ = uVar4;
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Unknown parameter pad for layer type ",0x25);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,(psVar5->_M_dataplus)._M_p,psVar5->_M_string_length);
        bVar8 = false;
      }
    }
  }
  if (((pVVar25->_has_bits_).has_bits_[0] & 0x400) != 0) {
    iVar22 = std::__cxx11::string::compare((char *)psVar5);
    if (iVar22 == 0) {
      *(byte *)(layer_param->_has_bits_).has_bits_ =
           (byte)(layer_param->_has_bits_).has_bits_[0] | 8;
      pCVar15 = layer_param->convolution_param_;
      if (pCVar15 == (ConvolutionParameter *)0x0) {
        pCVar15 = (ConvolutionParameter *)operator_new(0x98);
        ConvolutionParameter::ConvolutionParameter(pCVar15);
        layer_param->convolution_param_ = pCVar15;
      }
      uVar10 = pVVar25->kernelsize_;
      iVar22 = (pCVar15->kernel_size_).current_size_;
      if (iVar22 == (pCVar15->kernel_size_).total_size_) {
        google::protobuf::RepeatedField<unsigned_int>::Reserve(&pCVar15->kernel_size_,iVar22 + 1);
        iVar22 = (pCVar15->kernel_size_).current_size_;
      }
      (pCVar15->kernel_size_).current_size_ = iVar22 + 1;
      ((pCVar15->kernel_size_).rep_)->elements[iVar22] = uVar10;
    }
    else {
      iVar22 = std::__cxx11::string::compare((char *)psVar5);
      if (iVar22 == 0) {
        pbVar2 = (byte *)((long)(layer_param->_has_bits_).has_bits_ + 1);
        *pbVar2 = *pbVar2 | 0x10;
        pPVar16 = layer_param->pooling_param_;
        if (pPVar16 == (PoolingParameter *)0x0) {
          pPVar16 = (PoolingParameter *)operator_new(0x48);
          PoolingParameter::PoolingParameter(pPVar16);
          layer_param->pooling_param_ = pPVar16;
        }
        uVar4 = pVVar25->kernelsize_;
        (pPVar16->_has_bits_).has_bits_[0] = (pPVar16->_has_bits_).has_bits_[0] | 2;
        pPVar16->kernel_size_ = uVar4;
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Unknown parameter kernelsize for layer type ",0x2c);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,(psVar5->_M_dataplus)._M_p,psVar5->_M_string_length);
        bVar8 = false;
      }
    }
  }
  if (((pVVar25->_has_bits_).has_bits_[0] & 0x1000000) != 0) {
    iVar22 = std::__cxx11::string::compare((char *)psVar5);
    if (iVar22 == 0) {
      *(byte *)(layer_param->_has_bits_).has_bits_ =
           (byte)(layer_param->_has_bits_).has_bits_[0] | 8;
      pCVar15 = layer_param->convolution_param_;
      if (pCVar15 == (ConvolutionParameter *)0x0) {
        pCVar15 = (ConvolutionParameter *)operator_new(0x98);
        ConvolutionParameter::ConvolutionParameter(pCVar15);
        layer_param->convolution_param_ = pCVar15;
      }
      uVar4 = pVVar25->group_;
      (pCVar15->_has_bits_).has_bits_[0] = (pCVar15->_has_bits_).has_bits_[0] | 0x2000;
      pCVar15->group_ = uVar4;
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Unknown parameter group for layer type ",0x27);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,(psVar5->_M_dataplus)._M_p,psVar5->_M_string_length);
      bVar8 = false;
    }
  }
  if (((pVVar25->_has_bits_).has_bits_[0] & 0x2000000) != 0) {
    iVar22 = std::__cxx11::string::compare((char *)psVar5);
    if (iVar22 == 0) {
      *(byte *)(layer_param->_has_bits_).has_bits_ =
           (byte)(layer_param->_has_bits_).has_bits_[0] | 8;
      pCVar15 = layer_param->convolution_param_;
      if (pCVar15 == (ConvolutionParameter *)0x0) {
        pCVar15 = (ConvolutionParameter *)operator_new(0x98);
        ConvolutionParameter::ConvolutionParameter(pCVar15);
        layer_param->convolution_param_ = pCVar15;
      }
      uVar10 = pVVar25->stride_;
      iVar22 = (pCVar15->stride_).current_size_;
      if (iVar22 == (pCVar15->stride_).total_size_) {
        google::protobuf::RepeatedField<unsigned_int>::Reserve(&pCVar15->stride_,iVar22 + 1);
        iVar22 = (pCVar15->stride_).current_size_;
      }
      (pCVar15->stride_).current_size_ = iVar22 + 1;
      ((pCVar15->stride_).rep_)->elements[iVar22] = uVar10;
    }
    else {
      iVar22 = std::__cxx11::string::compare((char *)psVar5);
      if (iVar22 == 0) {
        pbVar2 = (byte *)((long)(layer_param->_has_bits_).has_bits_ + 1);
        *pbVar2 = *pbVar2 | 0x10;
        pPVar16 = layer_param->pooling_param_;
        if (pPVar16 == (PoolingParameter *)0x0) {
          pPVar16 = (PoolingParameter *)operator_new(0x48);
          PoolingParameter::PoolingParameter(pPVar16);
          layer_param->pooling_param_ = pPVar16;
        }
        uVar4 = pVVar25->stride_;
        (pPVar16->_has_bits_).has_bits_[0] = (pPVar16->_has_bits_).has_bits_[0] | 0x800;
        pPVar16->stride_ = uVar4;
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Unknown parameter stride for layer type ",0x28);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,(psVar5->_M_dataplus)._M_p,psVar5->_M_string_length);
        bVar8 = false;
      }
    }
  }
  if (((pVVar25->_has_bits_).has_bits_[0] & 0x800) != 0) {
    iVar22 = std::__cxx11::string::compare((char *)psVar5);
    if (iVar22 == 0) {
      iVar22 = pVVar25->pool_;
      if (iVar22 == 2) {
        pbVar2 = (byte *)((long)(layer_param->_has_bits_).has_bits_ + 1);
        *pbVar2 = *pbVar2 | 0x10;
        pPVar16 = layer_param->pooling_param_;
        if (pPVar16 == (PoolingParameter *)0x0) {
          pPVar16 = (PoolingParameter *)operator_new(0x48);
          PoolingParameter::PoolingParameter(pPVar16);
          layer_param->pooling_param_ = pPVar16;
        }
        bVar9 = PoolingParameter_PoolMethod_IsValid(2);
        if (!bVar9) {
LAB_0042cf90:
          __assert_fail("::caffe::PoolingParameter_PoolMethod_IsValid(value)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/include/caffe/proto/caffe.pb.h"
                        ,0x50e0,
                        "void caffe::PoolingParameter::set_pool(::caffe::PoolingParameter_PoolMethod)"
                       );
        }
        *(byte *)(pPVar16->_has_bits_).has_bits_ = (byte)(pPVar16->_has_bits_).has_bits_[0] | 1;
        pPVar16->pool_ = 2;
      }
      else if (iVar22 == 1) {
        pbVar2 = (byte *)((long)(layer_param->_has_bits_).has_bits_ + 1);
        *pbVar2 = *pbVar2 | 0x10;
        pPVar16 = layer_param->pooling_param_;
        if (pPVar16 == (PoolingParameter *)0x0) {
          pPVar16 = (PoolingParameter *)operator_new(0x48);
          PoolingParameter::PoolingParameter(pPVar16);
          layer_param->pooling_param_ = pPVar16;
        }
        bVar9 = PoolingParameter_PoolMethod_IsValid(1);
        if (!bVar9) goto LAB_0042cf90;
        *(byte *)(pPVar16->_has_bits_).has_bits_ = (byte)(pPVar16->_has_bits_).has_bits_[0] | 1;
        pPVar16->pool_ = 1;
      }
      else {
        if (iVar22 != 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Unknown pool method ",0x14);
          std::ostream::operator<<((ostream *)&std::cerr,iVar22);
          goto LAB_0042c0bd;
        }
        pbVar2 = (byte *)((long)(layer_param->_has_bits_).has_bits_ + 1);
        *pbVar2 = *pbVar2 | 0x10;
        pPVar16 = layer_param->pooling_param_;
        if (pPVar16 == (PoolingParameter *)0x0) {
          pPVar16 = (PoolingParameter *)operator_new(0x48);
          PoolingParameter::PoolingParameter(pPVar16);
          layer_param->pooling_param_ = pPVar16;
        }
        bVar9 = PoolingParameter_PoolMethod_IsValid(0);
        if (!bVar9) goto LAB_0042cf90;
        *(byte *)(pPVar16->_has_bits_).has_bits_ = (byte)(pPVar16->_has_bits_).has_bits_[0] | 1;
        pPVar16->pool_ = 0;
      }
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Unknown parameter pool for layer type ",0x26);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,(psVar5->_M_dataplus)._M_p,psVar5->_M_string_length);
LAB_0042c0bd:
      bVar8 = false;
    }
  }
  if (((pVVar25->_has_bits_).has_bits_[0] & 0x4000000) != 0) {
    iVar22 = std::__cxx11::string::compare((char *)psVar5);
    if (iVar22 == 0) {
      *(byte *)(layer_param->_has_bits_).has_bits_ =
           (byte)(layer_param->_has_bits_).has_bits_[0] | 0x20;
      this_00 = layer_param->dropout_param_;
      if (this_00 == (DropoutParameter *)0x0) {
        this_00 = (DropoutParameter *)operator_new(0x20);
        DropoutParameter::DropoutParameter(this_00);
        layer_param->dropout_param_ = this_00;
      }
      fVar3 = pVVar25->dropout_ratio_;
      (this_00->_has_bits_).has_bits_[0] = (this_00->_has_bits_).has_bits_[0] | 1;
      this_00->dropout_ratio_ = fVar3;
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Unknown parameter dropout_ratio for layer type ",0x2f);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,(psVar5->_M_dataplus)._M_p,psVar5->_M_string_length);
      bVar8 = false;
    }
  }
  if (((pVVar25->_has_bits_).has_bits_[0] & 0x8000000) != 0) {
    iVar22 = std::__cxx11::string::compare((char *)psVar5);
    if (iVar22 == 0) {
      pbVar2 = (byte *)((long)(layer_param->_has_bits_).has_bits_ + 1);
      *pbVar2 = *pbVar2 | 8;
      pLVar17 = layer_param->lrn_param_;
      if (pLVar17 == (LRNParameter *)0x0) {
        pLVar17 = (LRNParameter *)operator_new(0x30);
        LRNParameter::LRNParameter(pLVar17);
        layer_param->lrn_param_ = pLVar17;
      }
      uVar4 = pVVar25->local_size_;
      (pLVar17->_has_bits_).has_bits_[0] = (pLVar17->_has_bits_).has_bits_[0] | 4;
      pLVar17->local_size_ = uVar4;
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Unknown parameter local_size for layer type ",0x2c);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,(psVar5->_M_dataplus)._M_p,psVar5->_M_string_length);
      bVar8 = false;
    }
  }
  if (((pVVar25->_has_bits_).has_bits_[0] & 0x10000000) != 0) {
    iVar22 = std::__cxx11::string::compare((char *)psVar5);
    if (iVar22 == 0) {
      pbVar2 = (byte *)((long)(layer_param->_has_bits_).has_bits_ + 1);
      *pbVar2 = *pbVar2 | 8;
      pLVar17 = layer_param->lrn_param_;
      if (pLVar17 == (LRNParameter *)0x0) {
        pLVar17 = (LRNParameter *)operator_new(0x30);
        LRNParameter::LRNParameter(pLVar17);
        layer_param->lrn_param_ = pLVar17;
      }
      fVar3 = pVVar25->alpha_;
      (pLVar17->_has_bits_).has_bits_[0] = (pLVar17->_has_bits_).has_bits_[0] | 8;
      pLVar17->alpha_ = fVar3;
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Unknown parameter alpha for layer type ",0x27);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,(psVar5->_M_dataplus)._M_p,psVar5->_M_string_length);
      bVar8 = false;
    }
  }
  uVar10 = (pVVar25->_has_bits_).has_bits_[0];
  if ((uVar10 >> 0x1d & 1) != 0) {
    iVar22 = std::__cxx11::string::compare((char *)psVar5);
    if (iVar22 == 0) {
      pbVar2 = (byte *)((long)(layer_param->_has_bits_).has_bits_ + 1);
      *pbVar2 = *pbVar2 | 8;
      pLVar17 = layer_param->lrn_param_;
      if (pLVar17 == (LRNParameter *)0x0) {
        pLVar17 = (LRNParameter *)operator_new(0x30);
        LRNParameter::LRNParameter(pLVar17);
        layer_param->lrn_param_ = pLVar17;
      }
      fVar3 = pVVar25->beta_;
      (pLVar17->_has_bits_).has_bits_[0] = (pLVar17->_has_bits_).has_bits_[0] | 0x10;
      pLVar17->beta_ = fVar3;
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Unknown parameter beta for layer type ",0x26);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,(psVar5->_M_dataplus)._M_p,psVar5->_M_string_length);
      bVar8 = false;
    }
    uVar10 = (pVVar25->_has_bits_).has_bits_[0];
  }
  if ((int)uVar10 < 0) {
    iVar22 = std::__cxx11::string::compare((char *)psVar5);
    if (iVar22 == 0) {
      pbVar2 = (byte *)((long)(layer_param->_has_bits_).has_bits_ + 1);
      *pbVar2 = *pbVar2 | 8;
      pLVar17 = layer_param->lrn_param_;
      if (pLVar17 == (LRNParameter *)0x0) {
        pLVar17 = (LRNParameter *)operator_new(0x30);
        LRNParameter::LRNParameter(pLVar17);
        layer_param->lrn_param_ = pLVar17;
      }
      fVar3 = pVVar25->k_;
      (pLVar17->_has_bits_).has_bits_[0] = (pLVar17->_has_bits_).has_bits_[0] | 0x20;
      pLVar17->k_ = fVar3;
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Unknown parameter k for layer type ",0x23);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,(psVar5->_M_dataplus)._M_p,psVar5->_M_string_length);
      bVar8 = false;
    }
  }
  if (((pVVar25->_has_bits_).has_bits_[0] & 4) != 0) {
    iVar22 = std::__cxx11::string::compare((char *)psVar5);
    if (iVar22 == 0) {
      *(byte *)(layer_param->_has_bits_).has_bits_ =
           (byte)(layer_param->_has_bits_).has_bits_[0] | 0x10;
      pIVar20 = (ImageDataParameter *)layer_param->data_param_;
      if (pIVar20 == (ImageDataParameter *)0x0) {
        pIVar20 = (ImageDataParameter *)operator_new(0x48);
        DataParameter::DataParameter((DataParameter *)pIVar20);
        layer_param->data_param_ = (DataParameter *)pIVar20;
      }
    }
    else {
      iVar22 = std::__cxx11::string::compare((char *)psVar5);
      if (iVar22 == 0) {
        *(byte *)(layer_param->_has_bits_).has_bits_ =
             (byte)(layer_param->_has_bits_).has_bits_[0] | 0x40;
        pIVar20 = (ImageDataParameter *)layer_param->hdf5_data_param_;
        if (pIVar20 == (ImageDataParameter *)0x0) {
          pIVar20 = (ImageDataParameter *)operator_new(0x28);
          HDF5DataParameter::HDF5DataParameter((HDF5DataParameter *)pIVar20);
          layer_param->hdf5_data_param_ = (HDF5DataParameter *)pIVar20;
        }
      }
      else {
        iVar22 = std::__cxx11::string::compare((char *)psVar5);
        if (iVar22 != 0) {
          iVar22 = std::__cxx11::string::compare((char *)psVar5);
          if (iVar22 == 0) {
            pWVar21 = V1LayerParameter::mutable_window_data_param(layer_param);
            WindowDataParameter::set_source(pWVar21,(pVVar25->source_).ptr_);
          }
          else {
            iVar22 = std::__cxx11::string::compare((char *)psVar5);
            if (iVar22 == 0) {
              this_01 = V1LayerParameter::mutable_infogain_loss_param(layer_param);
              InfogainLossParameter::set_source(this_01,(pVVar25->source_).ptr_);
            }
            else {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"Unknown parameter source for layer type ",0x28);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,(psVar5->_M_dataplus)._M_p,psVar5->_M_string_length);
              bVar8 = false;
            }
          }
          goto LAB_0042c652;
        }
        pbVar2 = (byte *)((long)(layer_param->_has_bits_).has_bits_ + 1);
        *pbVar2 = *pbVar2 | 1;
        pIVar20 = layer_param->image_data_param_;
        if (pIVar20 == (ImageDataParameter *)0x0) {
          pIVar20 = (ImageDataParameter *)operator_new(0x50);
          ImageDataParameter::ImageDataParameter(pIVar20);
          layer_param->image_data_param_ = pIVar20;
        }
      }
    }
    psVar6 = (pVVar25->source_).ptr_;
    (pIVar20->_has_bits_).has_bits_[0] = (pIVar20->_has_bits_).has_bits_[0] | 1;
    psVar7 = (pIVar20->source_).ptr_;
    if (psVar7 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
      google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena(&pIVar20->source_,psVar6);
    }
    else {
      std::__cxx11::string::_M_assign((string *)psVar7);
    }
  }
LAB_0042c652:
  uVar10 = (pVVar25->_has_bits_).has_bits_[0];
  if ((uVar10 >> 0x1e & 1) != 0) {
    pbVar2 = (byte *)((long)(layer_param->_has_bits_).has_bits_ + 3);
    *pbVar2 = *pbVar2 | 2;
    pTVar18 = layer_param->transform_param_;
    if (pTVar18 == (TransformationParameter *)0x0) {
      pTVar18 = (TransformationParameter *)operator_new(0x40);
      TransformationParameter::TransformationParameter(pTVar18);
      layer_param->transform_param_ = pTVar18;
    }
    fVar3 = pVVar25->scale_;
    (pTVar18->_has_bits_).has_bits_[0] = (pTVar18->_has_bits_).has_bits_[0] | 0x20;
    pTVar18->scale_ = fVar3;
    uVar10 = (pVVar25->_has_bits_).has_bits_[0];
  }
  if ((uVar10 & 8) != 0) {
    pbVar2 = (byte *)((long)(layer_param->_has_bits_).has_bits_ + 3);
    *pbVar2 = *pbVar2 | 2;
    pTVar18 = layer_param->transform_param_;
    if (pTVar18 == (TransformationParameter *)0x0) {
      pTVar18 = (TransformationParameter *)operator_new(0x40);
      TransformationParameter::TransformationParameter(pTVar18);
      layer_param->transform_param_ = pTVar18;
    }
    psVar6 = (pVVar25->meanfile_).ptr_;
    (pTVar18->_has_bits_).has_bits_[0] = (pTVar18->_has_bits_).has_bits_[0] | 1;
    psVar7 = (pTVar18->mean_file_).ptr_;
    if (psVar7 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
      google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena(&pTVar18->mean_file_,psVar6)
      ;
    }
    else {
      std::__cxx11::string::_M_assign((string *)psVar7);
    }
  }
  if (((pVVar25->_has_bits_).has_bits_[0] & 0x1000) != 0) {
    iVar22 = std::__cxx11::string::compare((char *)psVar5);
    if (iVar22 == 0) {
      *(byte *)(layer_param->_has_bits_).has_bits_ =
           (byte)(layer_param->_has_bits_).has_bits_[0] | 0x10;
      pDVar19 = layer_param->data_param_;
      if (pDVar19 == (DataParameter *)0x0) {
        pDVar19 = (DataParameter *)operator_new(0x48);
        DataParameter::DataParameter(pDVar19);
        layer_param->data_param_ = pDVar19;
      }
      uVar4 = pVVar25->batchsize_;
      (pDVar19->_has_bits_).has_bits_[0] = (pDVar19->_has_bits_).has_bits_[0] | 4;
      pDVar19->batch_size_ = uVar4;
    }
    else {
      iVar22 = std::__cxx11::string::compare((char *)psVar5);
      if (iVar22 == 0) {
        *(byte *)(layer_param->_has_bits_).has_bits_ =
             (byte)(layer_param->_has_bits_).has_bits_[0] | 0x40;
        this_02 = layer_param->hdf5_data_param_;
        if (this_02 == (HDF5DataParameter *)0x0) {
          this_02 = (HDF5DataParameter *)operator_new(0x28);
          HDF5DataParameter::HDF5DataParameter(this_02);
          layer_param->hdf5_data_param_ = this_02;
        }
        uVar4 = pVVar25->batchsize_;
        (this_02->_has_bits_).has_bits_[0] = (this_02->_has_bits_).has_bits_[0] | 2;
        this_02->batch_size_ = uVar4;
      }
      else {
        iVar22 = std::__cxx11::string::compare((char *)psVar5);
        if (iVar22 == 0) {
          pbVar2 = (byte *)((long)(layer_param->_has_bits_).has_bits_ + 1);
          *pbVar2 = *pbVar2 | 1;
          pIVar20 = layer_param->image_data_param_;
          if (pIVar20 == (ImageDataParameter *)0x0) {
            pIVar20 = (ImageDataParameter *)operator_new(0x50);
            ImageDataParameter::ImageDataParameter(pIVar20);
            layer_param->image_data_param_ = pIVar20;
          }
          uVar4 = pVVar25->batchsize_;
          (pIVar20->_has_bits_).has_bits_[0] = (pIVar20->_has_bits_).has_bits_[0] | 0x800;
          pIVar20->batch_size_ = uVar4;
        }
        else {
          iVar22 = std::__cxx11::string::compare((char *)psVar5);
          if (iVar22 == 0) {
            pWVar21 = V1LayerParameter::mutable_window_data_param(layer_param);
            uVar4 = pVVar25->batchsize_;
            (pWVar21->_has_bits_).has_bits_[0] = (pWVar21->_has_bits_).has_bits_[0] | 0x10;
            pWVar21->batch_size_ = uVar4;
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"Unknown parameter batchsize for layer type ",0x2b);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,(psVar5->_M_dataplus)._M_p,psVar5->_M_string_length);
            bVar8 = false;
          }
        }
      }
    }
  }
  uVar10 = (pVVar25->_has_bits_).has_bits_[0];
  if ((uVar10 >> 0xd & 1) != 0) {
    pbVar2 = (byte *)((long)(layer_param->_has_bits_).has_bits_ + 3);
    *pbVar2 = *pbVar2 | 2;
    pTVar18 = layer_param->transform_param_;
    if (pTVar18 == (TransformationParameter *)0x0) {
      pTVar18 = (TransformationParameter *)operator_new(0x40);
      TransformationParameter::TransformationParameter(pTVar18);
      layer_param->transform_param_ = pTVar18;
    }
    uVar4 = pVVar25->cropsize_;
    (pTVar18->_has_bits_).has_bits_[0] = (pTVar18->_has_bits_).has_bits_[0] | 2;
    pTVar18->crop_size_ = uVar4;
    uVar10 = (pVVar25->_has_bits_).has_bits_[0];
  }
  if ((short)uVar10 < 0) {
    pbVar2 = (byte *)((long)(layer_param->_has_bits_).has_bits_ + 3);
    *pbVar2 = *pbVar2 | 2;
    pTVar18 = layer_param->transform_param_;
    if (pTVar18 == (TransformationParameter *)0x0) {
      pTVar18 = (TransformationParameter *)operator_new(0x40);
      TransformationParameter::TransformationParameter(pTVar18);
      layer_param->transform_param_ = pTVar18;
    }
    bVar9 = pVVar25->mirror_;
    (pTVar18->_has_bits_).has_bits_[0] = (pTVar18->_has_bits_).has_bits_[0] | 4;
    pTVar18->mirror_ = bVar9;
    uVar10 = (pVVar25->_has_bits_).has_bits_[0];
  }
  if ((uVar10 >> 0x11 & 1) != 0) {
    iVar22 = std::__cxx11::string::compare((char *)psVar5);
    if (iVar22 == 0) {
      *(byte *)(layer_param->_has_bits_).has_bits_ =
           (byte)(layer_param->_has_bits_).has_bits_[0] | 0x10;
      pDVar19 = layer_param->data_param_;
      if (pDVar19 == (DataParameter *)0x0) {
        pDVar19 = (DataParameter *)operator_new(0x48);
        DataParameter::DataParameter(pDVar19);
        layer_param->data_param_ = pDVar19;
      }
      uVar4 = pVVar25->rand_skip_;
      (pDVar19->_has_bits_).has_bits_[0] = (pDVar19->_has_bits_).has_bits_[0] | 0x10;
      pDVar19->rand_skip_ = uVar4;
    }
    else {
      iVar22 = std::__cxx11::string::compare((char *)psVar5);
      if (iVar22 == 0) {
        pbVar2 = (byte *)((long)(layer_param->_has_bits_).has_bits_ + 1);
        *pbVar2 = *pbVar2 | 1;
        pIVar20 = layer_param->image_data_param_;
        if (pIVar20 == (ImageDataParameter *)0x0) {
          pIVar20 = (ImageDataParameter *)operator_new(0x50);
          ImageDataParameter::ImageDataParameter(pIVar20);
          layer_param->image_data_param_ = pIVar20;
        }
        uVar4 = pVVar25->rand_skip_;
        (pIVar20->_has_bits_).has_bits_[0] = (pIVar20->_has_bits_).has_bits_[0] | 0x10;
        pIVar20->rand_skip_ = uVar4;
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Unknown parameter rand_skip for layer type ",0x2b);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,(psVar5->_M_dataplus)._M_p,psVar5->_M_string_length);
        bVar8 = false;
      }
    }
  }
  if (((pVVar25->_has_bits_).has_bits_[0] & 0x10000) != 0) {
    iVar22 = std::__cxx11::string::compare((char *)psVar5);
    if (iVar22 == 0) {
      pbVar2 = (byte *)((long)(layer_param->_has_bits_).has_bits_ + 1);
      *pbVar2 = *pbVar2 | 1;
      pIVar20 = layer_param->image_data_param_;
      if (pIVar20 == (ImageDataParameter *)0x0) {
        pIVar20 = (ImageDataParameter *)operator_new(0x50);
        ImageDataParameter::ImageDataParameter(pIVar20);
        layer_param->image_data_param_ = pIVar20;
      }
      bVar9 = pVVar25->shuffle_images_;
      (pIVar20->_has_bits_).has_bits_[0] = (pIVar20->_has_bits_).has_bits_[0] | 0x20;
      pIVar20->shuffle_ = bVar9;
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Unknown parameter shuffle for layer type ",0x29);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,(psVar5->_M_dataplus)._M_p,psVar5->_M_string_length);
      bVar8 = false;
    }
  }
  if (((pVVar25->_has_bits_).has_bits_[0] & 0x200000) != 0) {
    iVar22 = std::__cxx11::string::compare((char *)psVar5);
    if (iVar22 == 0) {
      pbVar2 = (byte *)((long)(layer_param->_has_bits_).has_bits_ + 1);
      *pbVar2 = *pbVar2 | 1;
      pIVar20 = layer_param->image_data_param_;
      if (pIVar20 == (ImageDataParameter *)0x0) {
        pIVar20 = (ImageDataParameter *)operator_new(0x50);
        ImageDataParameter::ImageDataParameter(pIVar20);
        layer_param->image_data_param_ = pIVar20;
      }
      uVar4 = pVVar25->new_height_;
      (pIVar20->_has_bits_).has_bits_[0] = (pIVar20->_has_bits_).has_bits_[0] | 0x80;
      pIVar20->new_height_ = uVar4;
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Unknown parameter new_height for layer type ",0x2c);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,(psVar5->_M_dataplus)._M_p,psVar5->_M_string_length);
      bVar8 = false;
    }
  }
  if (((pVVar25->_has_bits_).has_bits_[0] & 0x4000) != 0) {
    iVar22 = std::__cxx11::string::compare((char *)psVar5);
    if (iVar22 == 0) {
      pbVar2 = (byte *)((long)(layer_param->_has_bits_).has_bits_ + 1);
      *pbVar2 = *pbVar2 | 1;
      pIVar20 = layer_param->image_data_param_;
      if (pIVar20 == (ImageDataParameter *)0x0) {
        pIVar20 = (ImageDataParameter *)operator_new(0x50);
        ImageDataParameter::ImageDataParameter(pIVar20);
        layer_param->image_data_param_ = pIVar20;
      }
      uVar4 = pVVar25->new_width_;
      (pIVar20->_has_bits_).has_bits_[0] = (pIVar20->_has_bits_).has_bits_[0] | 0x100;
      pIVar20->new_width_ = uVar4;
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Unknown parameter new_width for layer type ",0x2b);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,(psVar5->_M_dataplus)._M_p,psVar5->_M_string_length);
      bVar8 = false;
    }
  }
  if (((pVVar25->_has_bits_).has_bits_[0] & 0x400000) != 0) {
    iVar22 = std::__cxx11::string::compare((char *)psVar5);
    if (iVar22 == 0) {
      *(byte *)(layer_param->_has_bits_).has_bits_ =
           (byte)(layer_param->_has_bits_).has_bits_[0] | 4;
      this_03 = layer_param->concat_param_;
      if (this_03 == (ConcatParameter *)0x0) {
        this_03 = (ConcatParameter *)operator_new(0x20);
        ConcatParameter::ConcatParameter(this_03);
        layer_param->concat_param_ = this_03;
      }
      uVar4 = pVVar25->concat_dim_;
      (this_03->_has_bits_).has_bits_[0] = (this_03->_has_bits_).has_bits_[0] | 1;
      this_03->concat_dim_ = uVar4;
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Unknown parameter concat_dim for layer type ",0x2c);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,(psVar5->_M_dataplus)._M_p,psVar5->_M_string_length);
      bVar8 = false;
    }
  }
  if (((pVVar25->_has_bits_).has_bits_[1] & 1) != 0) {
    iVar22 = std::__cxx11::string::compare((char *)psVar5);
    if (iVar22 == 0) {
      pbVar2 = (byte *)((long)(layer_param->_has_bits_).has_bits_ + 1);
      *pbVar2 = *pbVar2 | 0x20;
      pWVar21 = layer_param->window_data_param_;
      if (pWVar21 == (WindowDataParameter *)0x0) {
        pWVar21 = (WindowDataParameter *)operator_new(0x58);
        WindowDataParameter::WindowDataParameter(pWVar21);
        layer_param->window_data_param_ = pWVar21;
      }
      fVar3 = pVVar25->det_fg_threshold_;
      (pWVar21->_has_bits_).has_bits_[0] = (pWVar21->_has_bits_).has_bits_[0] | 0x400;
      pWVar21->fg_threshold_ = fVar3;
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Unknown parameter det_fg_threshold for layer type ",0x32);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,(psVar5->_M_dataplus)._M_p,psVar5->_M_string_length);
      bVar8 = false;
    }
  }
  if (((pVVar25->_has_bits_).has_bits_[1] & 2) != 0) {
    iVar22 = std::__cxx11::string::compare((char *)psVar5);
    if (iVar22 == 0) {
      pbVar2 = (byte *)((long)(layer_param->_has_bits_).has_bits_ + 1);
      *pbVar2 = *pbVar2 | 0x20;
      pWVar21 = layer_param->window_data_param_;
      if (pWVar21 == (WindowDataParameter *)0x0) {
        pWVar21 = (WindowDataParameter *)operator_new(0x58);
        WindowDataParameter::WindowDataParameter(pWVar21);
        layer_param->window_data_param_ = pWVar21;
      }
      fVar3 = pVVar25->det_bg_threshold_;
      (pWVar21->_has_bits_).has_bits_[0] = (pWVar21->_has_bits_).has_bits_[0] | 0x800;
      pWVar21->bg_threshold_ = fVar3;
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Unknown parameter det_bg_threshold for layer type ",0x32);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,(psVar5->_M_dataplus)._M_p,psVar5->_M_string_length);
      bVar8 = false;
    }
  }
  if (((pVVar25->_has_bits_).has_bits_[1] & 4) != 0) {
    iVar22 = std::__cxx11::string::compare((char *)psVar5);
    if (iVar22 == 0) {
      pbVar2 = (byte *)((long)(layer_param->_has_bits_).has_bits_ + 1);
      *pbVar2 = *pbVar2 | 0x20;
      pWVar21 = layer_param->window_data_param_;
      if (pWVar21 == (WindowDataParameter *)0x0) {
        pWVar21 = (WindowDataParameter *)operator_new(0x58);
        WindowDataParameter::WindowDataParameter(pWVar21);
        layer_param->window_data_param_ = pWVar21;
      }
      fVar3 = pVVar25->det_fg_fraction_;
      (pWVar21->_has_bits_).has_bits_[0] = (pWVar21->_has_bits_).has_bits_[0] | 0x1000;
      pWVar21->fg_fraction_ = fVar3;
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Unknown parameter det_fg_fraction for layer type ",0x31);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,(psVar5->_M_dataplus)._M_p,psVar5->_M_string_length);
      bVar8 = false;
    }
  }
  if (((pVVar25->_has_bits_).has_bits_[0] & 0x40000) != 0) {
    iVar22 = std::__cxx11::string::compare((char *)psVar5);
    if (iVar22 == 0) {
      pbVar2 = (byte *)((long)(layer_param->_has_bits_).has_bits_ + 1);
      *pbVar2 = *pbVar2 | 0x20;
      pWVar21 = layer_param->window_data_param_;
      if (pWVar21 == (WindowDataParameter *)0x0) {
        pWVar21 = (WindowDataParameter *)operator_new(0x58);
        WindowDataParameter::WindowDataParameter(pWVar21);
        layer_param->window_data_param_ = pWVar21;
      }
      uVar4 = pVVar25->det_context_pad_;
      (pWVar21->_has_bits_).has_bits_[0] = (pWVar21->_has_bits_).has_bits_[0] | 0x100;
      pWVar21->context_pad_ = uVar4;
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Unknown parameter det_context_pad for layer type ",0x31);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,(psVar5->_M_dataplus)._M_p,psVar5->_M_string_length);
      bVar8 = false;
    }
  }
  if (((pVVar25->_has_bits_).has_bits_[0] & 0x10) != 0) {
    iVar22 = std::__cxx11::string::compare((char *)psVar5);
    if (iVar22 == 0) {
      pbVar2 = (byte *)((long)(layer_param->_has_bits_).has_bits_ + 1);
      *pbVar2 = *pbVar2 | 0x20;
      pWVar21 = layer_param->window_data_param_;
      if (pWVar21 == (WindowDataParameter *)0x0) {
        pWVar21 = (WindowDataParameter *)operator_new(0x58);
        WindowDataParameter::WindowDataParameter(pWVar21);
        layer_param->window_data_param_ = pWVar21;
      }
      psVar6 = (pVVar25->det_crop_mode_).ptr_;
      (pWVar21->_has_bits_).has_bits_[0] = (pWVar21->_has_bits_).has_bits_[0] | 4;
      psVar7 = (pWVar21->crop_mode_).ptr_;
      if (psVar7 == (string *)&WindowDataParameter::_default_crop_mode__abi_cxx11_) {
        google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
                  (&pWVar21->crop_mode_,psVar6);
      }
      else {
        std::__cxx11::string::_M_assign((string *)psVar7);
      }
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Unknown parameter det_crop_mode for layer type ",0x2f);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,(psVar5->_M_dataplus)._M_p,psVar5->_M_string_length);
      bVar8 = false;
    }
  }
  if (((pVVar25->_has_bits_).has_bits_[0] & 0x80) != 0) {
    iVar22 = std::__cxx11::string::compare((char *)psVar5);
    if (iVar22 == 0) {
      *(byte *)(layer_param->_has_bits_).has_bits_ =
           (byte)(layer_param->_has_bits_).has_bits_[0] | 0x80;
      this_04 = layer_param->hdf5_output_param_;
      if (this_04 == (HDF5OutputParameter *)0x0) {
        this_04 = (HDF5OutputParameter *)operator_new(0x20);
        HDF5OutputParameter::HDF5OutputParameter(this_04);
        layer_param->hdf5_output_param_ = this_04;
      }
      from_00 = pVVar25->hdf5_output_param_;
      if (from_00 == (HDF5OutputParameter *)0x0) {
        from_00 = (HDF5OutputParameter *)&_HDF5OutputParameter_default_instance_;
      }
      HDF5OutputParameter::CopyFrom(this_04,from_00);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Unknown parameter hdf5_output_param for layer type ",0x33);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,(psVar5->_M_dataplus)._M_p,psVar5->_M_string_length);
      bVar8 = false;
    }
  }
  return bVar8;
}

Assistant:

bool UpgradeV0LayerParameter(const V1LayerParameter& v0_layer_connection,
                             V1LayerParameter* layer_param) {
  bool is_fully_compatible = true;
  layer_param->Clear();
  for (int i = 0; i < v0_layer_connection.bottom_size(); ++i) {
    layer_param->add_bottom(v0_layer_connection.bottom(i));
  }
  for (int i = 0; i < v0_layer_connection.top_size(); ++i) {
    layer_param->add_top(v0_layer_connection.top(i));
  }
  if (v0_layer_connection.has_layer()) {
    const V0LayerParameter& v0_layer_param = v0_layer_connection.layer();
    if (v0_layer_param.has_name()) {
      layer_param->set_name(v0_layer_param.name());
    }
    const string& type = v0_layer_param.type();
    if (v0_layer_param.has_type()) {
      layer_param->set_type(UpgradeV0LayerType(type));
    }
    for (int i = 0; i < v0_layer_param.blobs_size(); ++i) {
      layer_param->add_blobs()->CopyFrom(v0_layer_param.blobs(i));
    }
    for (int i = 0; i < v0_layer_param.blobs_lr_size(); ++i) {
      layer_param->add_blobs_lr(v0_layer_param.blobs_lr(i));
    }
    for (int i = 0; i < v0_layer_param.weight_decay_size(); ++i) {
      layer_param->add_weight_decay(v0_layer_param.weight_decay(i));
    }
    if (v0_layer_param.has_num_output()) {
      if (type == "conv") {
        layer_param->mutable_convolution_param()->set_num_output(
            v0_layer_param.num_output());
      } else if (type == "innerproduct") {
        layer_param->mutable_inner_product_param()->set_num_output(
            v0_layer_param.num_output());
      } else {
        LOG(ERROR) << "Unknown parameter num_output for layer type " << type;
        is_fully_compatible = false;
      }
    }
    if (v0_layer_param.has_biasterm()) {
      if (type == "conv") {
        layer_param->mutable_convolution_param()->set_bias_term(
            v0_layer_param.biasterm());
      } else if (type == "innerproduct") {
        layer_param->mutable_inner_product_param()->set_bias_term(
            v0_layer_param.biasterm());
      } else {
        LOG(ERROR) << "Unknown parameter biasterm for layer type " << type;
        is_fully_compatible = false;
      }
    }
    if (v0_layer_param.has_weight_filler()) {
      if (type == "conv") {
        layer_param->mutable_convolution_param()->
            mutable_weight_filler()->CopyFrom(v0_layer_param.weight_filler());
      } else if (type == "innerproduct") {
        layer_param->mutable_inner_product_param()->
            mutable_weight_filler()->CopyFrom(v0_layer_param.weight_filler());
      } else {
        LOG(ERROR) << "Unknown parameter weight_filler for layer type " << type;
        is_fully_compatible = false;
      }
    }
    if (v0_layer_param.has_bias_filler()) {
      if (type == "conv") {
        layer_param->mutable_convolution_param()->
            mutable_bias_filler()->CopyFrom(v0_layer_param.bias_filler());
      } else if (type == "innerproduct") {
        layer_param->mutable_inner_product_param()->
            mutable_bias_filler()->CopyFrom(v0_layer_param.bias_filler());
      } else {
        LOG(ERROR) << "Unknown parameter bias_filler for layer type " << type;
        is_fully_compatible = false;
      }
    }
    if (v0_layer_param.has_pad()) {
      if (type == "conv") {
        layer_param->mutable_convolution_param()->add_pad(v0_layer_param.pad());
      } else if (type == "pool") {
        layer_param->mutable_pooling_param()->set_pad(v0_layer_param.pad());
      } else {
        LOG(ERROR) << "Unknown parameter pad for layer type " << type;
        is_fully_compatible = false;
      }
    }
    if (v0_layer_param.has_kernelsize()) {
      if (type == "conv") {
        layer_param->mutable_convolution_param()->add_kernel_size(
            v0_layer_param.kernelsize());
      } else if (type == "pool") {
        layer_param->mutable_pooling_param()->set_kernel_size(
            v0_layer_param.kernelsize());
      } else {
        LOG(ERROR) << "Unknown parameter kernelsize for layer type " << type;
        is_fully_compatible = false;
      }
    }
    if (v0_layer_param.has_group()) {
      if (type == "conv") {
        layer_param->mutable_convolution_param()->set_group(
            v0_layer_param.group());
      } else {
        LOG(ERROR) << "Unknown parameter group for layer type " << type;
        is_fully_compatible = false;
      }
    }
    if (v0_layer_param.has_stride()) {
      if (type == "conv") {
        layer_param->mutable_convolution_param()->add_stride(
            v0_layer_param.stride());
      } else if (type == "pool") {
        layer_param->mutable_pooling_param()->set_stride(
            v0_layer_param.stride());
      } else {
        LOG(ERROR) << "Unknown parameter stride for layer type " << type;
        is_fully_compatible = false;
      }
    }
    if (v0_layer_param.has_pool()) {
      if (type == "pool") {
        V0LayerParameter_PoolMethod pool = v0_layer_param.pool();
        switch (pool) {
        case V0LayerParameter_PoolMethod_MAX:
          layer_param->mutable_pooling_param()->set_pool(
              PoolingParameter_PoolMethod_MAX);
          break;
        case V0LayerParameter_PoolMethod_AVE:
          layer_param->mutable_pooling_param()->set_pool(
              PoolingParameter_PoolMethod_AVE);
          break;
        case V0LayerParameter_PoolMethod_STOCHASTIC:
          layer_param->mutable_pooling_param()->set_pool(
              PoolingParameter_PoolMethod_STOCHASTIC);
          break;
        default:
          LOG(ERROR) << "Unknown pool method " << pool;
          is_fully_compatible = false;
        }
      } else {
        LOG(ERROR) << "Unknown parameter pool for layer type " << type;
        is_fully_compatible = false;
      }
    }
    if (v0_layer_param.has_dropout_ratio()) {
      if (type == "dropout") {
        layer_param->mutable_dropout_param()->set_dropout_ratio(
            v0_layer_param.dropout_ratio());
      } else {
        LOG(ERROR) << "Unknown parameter dropout_ratio for layer type " << type;
        is_fully_compatible = false;
      }
    }
    if (v0_layer_param.has_local_size()) {
      if (type == "lrn") {
        layer_param->mutable_lrn_param()->set_local_size(
            v0_layer_param.local_size());
      } else {
        LOG(ERROR) << "Unknown parameter local_size for layer type " << type;
        is_fully_compatible = false;
      }
    }
    if (v0_layer_param.has_alpha()) {
      if (type == "lrn") {
        layer_param->mutable_lrn_param()->set_alpha(v0_layer_param.alpha());
      } else {
        LOG(ERROR) << "Unknown parameter alpha for layer type " << type;
        is_fully_compatible = false;
      }
    }
    if (v0_layer_param.has_beta()) {
      if (type == "lrn") {
        layer_param->mutable_lrn_param()->set_beta(v0_layer_param.beta());
      } else {
        LOG(ERROR) << "Unknown parameter beta for layer type " << type;
        is_fully_compatible = false;
      }
    }
    if (v0_layer_param.has_k()) {
      if (type == "lrn") {
        layer_param->mutable_lrn_param()->set_k(v0_layer_param.k());
      } else {
        LOG(ERROR) << "Unknown parameter k for layer type " << type;
        is_fully_compatible = false;
      }
    }
    if (v0_layer_param.has_source()) {
      if (type == "data") {
        layer_param->mutable_data_param()->set_source(v0_layer_param.source());
      } else if (type == "hdf5_data") {
        layer_param->mutable_hdf5_data_param()->set_source(
            v0_layer_param.source());
      } else if (type == "images") {
        layer_param->mutable_image_data_param()->set_source(
            v0_layer_param.source());
      } else if (type == "window_data") {
        layer_param->mutable_window_data_param()->set_source(
            v0_layer_param.source());
      } else if (type == "infogain_loss") {
        layer_param->mutable_infogain_loss_param()->set_source(
            v0_layer_param.source());
      } else {
        LOG(ERROR) << "Unknown parameter source for layer type " << type;
        is_fully_compatible = false;
      }
    }
    if (v0_layer_param.has_scale()) {
      layer_param->mutable_transform_param()->
          set_scale(v0_layer_param.scale());
    }
    if (v0_layer_param.has_meanfile()) {
      layer_param->mutable_transform_param()->
          set_mean_file(v0_layer_param.meanfile());
    }
    if (v0_layer_param.has_batchsize()) {
      if (type == "data") {
        layer_param->mutable_data_param()->set_batch_size(
            v0_layer_param.batchsize());
      } else if (type == "hdf5_data") {
        layer_param->mutable_hdf5_data_param()->set_batch_size(
            v0_layer_param.batchsize());
      } else if (type == "images") {
        layer_param->mutable_image_data_param()->set_batch_size(
            v0_layer_param.batchsize());
      } else if (type == "window_data") {
        layer_param->mutable_window_data_param()->set_batch_size(
            v0_layer_param.batchsize());
      } else {
        LOG(ERROR) << "Unknown parameter batchsize for layer type " << type;
        is_fully_compatible = false;
      }
    }
    if (v0_layer_param.has_cropsize()) {
      layer_param->mutable_transform_param()->
          set_crop_size(v0_layer_param.cropsize());
    }
    if (v0_layer_param.has_mirror()) {
      layer_param->mutable_transform_param()->
          set_mirror(v0_layer_param.mirror());
    }
    if (v0_layer_param.has_rand_skip()) {
      if (type == "data") {
        layer_param->mutable_data_param()->set_rand_skip(
            v0_layer_param.rand_skip());
      } else if (type == "images") {
        layer_param->mutable_image_data_param()->set_rand_skip(
            v0_layer_param.rand_skip());
      } else {
        LOG(ERROR) << "Unknown parameter rand_skip for layer type " << type;
        is_fully_compatible = false;
      }
    }
    if (v0_layer_param.has_shuffle_images()) {
      if (type == "images") {
        layer_param->mutable_image_data_param()->set_shuffle(
            v0_layer_param.shuffle_images());
      } else {
        LOG(ERROR) << "Unknown parameter shuffle for layer type " << type;
        is_fully_compatible = false;
      }
    }
    if (v0_layer_param.has_new_height()) {
      if (type == "images") {
        layer_param->mutable_image_data_param()->set_new_height(
            v0_layer_param.new_height());
      } else {
        LOG(ERROR) << "Unknown parameter new_height for layer type " << type;
        is_fully_compatible = false;
      }
    }
    if (v0_layer_param.has_new_width()) {
      if (type == "images") {
        layer_param->mutable_image_data_param()->set_new_width(
            v0_layer_param.new_width());
      } else {
        LOG(ERROR) << "Unknown parameter new_width for layer type " << type;
        is_fully_compatible = false;
      }
    }
    if (v0_layer_param.has_concat_dim()) {
      if (type == "concat") {
        layer_param->mutable_concat_param()->set_concat_dim(
            v0_layer_param.concat_dim());
      } else {
        LOG(ERROR) << "Unknown parameter concat_dim for layer type " << type;
        is_fully_compatible = false;
      }
    }
    if (v0_layer_param.has_det_fg_threshold()) {
      if (type == "window_data") {
        layer_param->mutable_window_data_param()->set_fg_threshold(
            v0_layer_param.det_fg_threshold());
      } else {
        LOG(ERROR) << "Unknown parameter det_fg_threshold for layer type "
                   << type;
        is_fully_compatible = false;
      }
    }
    if (v0_layer_param.has_det_bg_threshold()) {
      if (type == "window_data") {
        layer_param->mutable_window_data_param()->set_bg_threshold(
            v0_layer_param.det_bg_threshold());
      } else {
        LOG(ERROR) << "Unknown parameter det_bg_threshold for layer type "
                   << type;
        is_fully_compatible = false;
      }
    }
    if (v0_layer_param.has_det_fg_fraction()) {
      if (type == "window_data") {
        layer_param->mutable_window_data_param()->set_fg_fraction(
            v0_layer_param.det_fg_fraction());
      } else {
        LOG(ERROR) << "Unknown parameter det_fg_fraction for layer type "
                   << type;
        is_fully_compatible = false;
      }
    }
    if (v0_layer_param.has_det_context_pad()) {
      if (type == "window_data") {
        layer_param->mutable_window_data_param()->set_context_pad(
            v0_layer_param.det_context_pad());
      } else {
        LOG(ERROR) << "Unknown parameter det_context_pad for layer type "
                   << type;
        is_fully_compatible = false;
      }
    }
    if (v0_layer_param.has_det_crop_mode()) {
      if (type == "window_data") {
        layer_param->mutable_window_data_param()->set_crop_mode(
            v0_layer_param.det_crop_mode());
      } else {
        LOG(ERROR) << "Unknown parameter det_crop_mode for layer type "
                   << type;
        is_fully_compatible = false;
      }
    }
    if (v0_layer_param.has_hdf5_output_param()) {
      if (type == "hdf5_output") {
        layer_param->mutable_hdf5_output_param()->CopyFrom(
            v0_layer_param.hdf5_output_param());
      } else {
        LOG(ERROR) << "Unknown parameter hdf5_output_param for layer type "
                   << type;
        is_fully_compatible = false;
      }
    }
  }
  return is_fully_compatible;
}